

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

void file_lock(ang_file *f)

{
  int __fd;
  ushort local_30 [4];
  flock lock;
  ang_file *f_local;
  
  local_30[0] = (ushort)(f->mode != MODE_READ);
  local_30[1] = 0;
  lock.l_type = 0;
  lock.l_whence = 0;
  lock._4_4_ = 0;
  lock.l_start = 0;
  lock.l_len._0_4_ = 0;
  lock._24_8_ = f;
  __fd = fileno((FILE *)f->fh);
  fcntl(__fd,7,local_30);
  return;
}

Assistant:

void file_lock(ang_file *f)
{
#if defined(HAVE_FCNTL_H) && defined(UNIX)
	struct flock lock;
	lock.l_type = (f->mode == MODE_READ ? F_RDLCK : F_WRLCK);
	lock.l_whence = SEEK_SET;
	lock.l_start = 0;
	lock.l_len = 0;
	lock.l_pid = 0;
	fcntl(fileno(f->fh), F_SETLKW, &lock);
#endif /* HAVE_FCNTL_H && UNIX */
}